

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O0

void __thiscall ManyDoublesParseTest::ManyDoublesParseTest(ManyDoublesParseTest *this)

{
  ManyDoublesParseTest *this_local;
  
  ThreadedTest::ThreadedTest(&this->super_ThreadedTest);
  (this->super_ThreadedTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ManyDoublesParseTest_0016fc70;
  return;
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(halfbits) {
      LOG_COMPLETION(halfbits);
      uint64_t bits = (static_cast<uint64_t>(halfbits) << 32) | halfbits;
      if (is_infinity_or_nan(bits))
        continue;

      double value = bit_cast<double>(bits);
      int len = snprintf(buffer, sizeof(buffer), "%a", value);

      uint64_t me;
      ASSERT_EQ(Result::Ok,
                ParseDouble(LiteralType::Hexfloat, buffer, buffer + len, &me));
      ASSERT_EQ(me, bits);
    }
    LOG_DONE();
  }